

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

ssize_t __thiscall
kj::anon_unknown_35::InMemoryFile::write(InMemoryFile *this,int __fd,void *__buf,size_t __n)

{
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *this_00;
  Impl *this_01;
  ulong uVar1;
  int iVar2;
  ssize_t in_RAX;
  undefined4 extraout_var;
  ssize_t extraout_RAX;
  ulong capacity;
  undefined4 in_register_00000034;
  ulong uVar3;
  Fault f;
  Locked<kj::(anonymous_namespace)::InMemoryFile::Impl> lock;
  Fault local_50;
  void *local_48;
  MutexGuarded<kj::(anonymous_namespace)::InMemoryFile::Impl> *local_40;
  Impl *local_38;
  
  uVar3 = CONCAT44(in_register_00000034,__fd);
  if (__n != 0) {
    this_00 = &this->impl;
    local_48 = __buf;
    _::Mutex::lock(&this_00->mutex,EXCLUSIVE);
    this_01 = &(this->impl).value;
    local_40 = this_00;
    local_38 = this_01;
    iVar2 = (**((this->impl).value.clock)->_vptr_Clock)();
    (this->impl).value.lastModified.value.value = CONCAT44(extraout_var,iVar2);
    capacity = __n + uVar3;
    if (CARRY8(__n,uVar3)) {
      _::Debug::Fault::Fault<kj::Exception::Type,char_const(&)[33]>
                (&local_50,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/Cosmic-Sans[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x346,FAILED,"end >= offset","\"write() request overflows uint64\"",
                 (char (*) [33])"write() request overflows uint64");
      _::Debug::Fault::fatal(&local_50);
    }
    Impl::ensureCapacity(this_01,capacity);
    uVar1 = (this->impl).value.size;
    if (capacity < uVar1) {
      capacity = uVar1;
    }
    (this->impl).value.size = capacity;
    memcpy((this->impl).value.bytes.ptr + uVar3,local_48,__n);
    _::Mutex::unlock(&this_00->mutex,EXCLUSIVE);
    in_RAX = extraout_RAX;
  }
  return in_RAX;
}

Assistant:

void write(uint64_t offset, ArrayPtr<const byte> data) const override {
    if (data.size() == 0) return;
    auto lock = impl.lockExclusive();
    lock->modified();
    uint64_t end = offset + data.size();
    KJ_REQUIRE(end >= offset, "write() request overflows uint64");
    lock->ensureCapacity(end);
    lock->size = kj::max(lock->size, end);
    memcpy(lock->bytes.begin() + offset, data.begin(), data.size());
  }